

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

void __thiscall
soplex::SPxBoundFlippingRT<double>::collectBreakpointsMax
          (SPxBoundFlippingRT<double> *this,int *nBp,int *minIdx,int *idx,int nnz,double *upd,
          double *vec,double *upp,double *low,BreakpointSource src)

{
  Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *this_00;
  int *piVar1;
  double dVar2;
  int iVar3;
  pointer pBVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double local_60;
  
  if (*nBp == 0) {
    pBVar4 = (pointer)infinity();
  }
  else {
    pBVar4 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start + *minIdx;
  }
  local_60 = pBVar4->val;
  piVar1 = idx + nnz;
  this_00 = &this->breakpoints;
  do {
    if (piVar1 <= idx) {
      return;
    }
    iVar3 = *idx;
    dVar8 = upd[iVar3];
    dVar2 = (this->super_SPxFastRT<double>).epsilon;
    if (dVar8 <= dVar2) {
      if (-dVar2 <= dVar8) {
        iVar6 = *nBp;
        pBVar4 = (this_00->data).
                 super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        dVar2 = low[iVar3];
        pdVar5 = (double *)infinity();
        iVar6 = *nBp;
        pBVar4 = (this_00->data).
                 super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (-*pdVar5 < dVar2) {
          dVar2 = (this->super_SPxFastRT<double>).fastDelta;
          uVar7 = -(ulong)(low[iVar3] - vec[iVar3] < 0.0);
          dVar8 = (double)(~uVar7 & (ulong)-dVar2 |
                          (ulong)((low[iVar3] - vec[iVar3]) - dVar2) & uVar7) / dVar8;
          pBVar4[iVar6].idx = iVar3;
          iVar6 = *nBp;
          pBVar4[iVar6].src = src;
          pBVar4[iVar6].val = dVar8;
          if (dVar8 < local_60) {
            *minIdx = iVar6;
            iVar6 = *nBp;
            local_60 = dVar8;
          }
          goto LAB_00209373;
        }
      }
    }
    else {
      dVar2 = upp[iVar3];
      pdVar5 = (double *)infinity();
      iVar6 = *nBp;
      pBVar4 = (this_00->data).
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (dVar2 < *pdVar5) {
        dVar2 = (this->super_SPxFastRT<double>).fastDelta;
        uVar7 = -(ulong)(0.0 < upp[iVar3] - vec[iVar3]);
        dVar8 = (double)(~uVar7 & (ulong)dVar2 | (ulong)((upp[iVar3] - vec[iVar3]) + dVar2) & uVar7)
                / dVar8;
        pBVar4[iVar6].idx = iVar3;
        iVar6 = *nBp;
        pBVar4[iVar6].src = src;
        pBVar4[iVar6].val = dVar8;
        if (dVar8 < local_60) {
          *minIdx = iVar6;
          iVar6 = *nBp;
          local_60 = dVar8;
        }
LAB_00209373:
        iVar6 = iVar6 + 1;
        *nBp = iVar6;
      }
    }
    if ((int)((ulong)((long)(this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4) >> 4) <=
        iVar6) {
      Array<soplex::SPxBoundFlippingRT<double>::Breakpoint>::reSize(this_00,iVar6 * 2);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}